

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strencodings.cpp
# Opt level: O1

bool ParseUInt32(string_view str,uint32_t *out)

{
  bool bVar1;
  char *__first;
  ulong uVar2;
  char *__last;
  long in_FS_OFFSET;
  bool bVar3;
  bool bVar4;
  __integer_from_chars_result_type<unsigned_int> _Var5;
  uint result;
  uint32_t local_1c;
  long local_18;
  
  __first = str._M_str;
  uVar2 = str._M_len;
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (((uVar2 < 2) || (*__first != '+')) || (__first[1] != '-')) {
    if ((uVar2 != 0) && (*__first == '+')) {
      uVar2 = uVar2 - 1;
      __first = __first + 1;
    }
    __last = __first + uVar2;
    _Var5 = std::from_chars<unsigned_int>(__first,__last,&local_1c,10);
    bVar3 = _Var5.ptr == __last;
    bVar4 = _Var5.ec == 0;
    bVar1 = bVar4 && bVar3;
    if ((out != (uint32_t *)0x0) && (bVar4 && bVar3)) {
      *out = local_1c;
      bVar1 = true;
    }
  }
  else {
    bVar1 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool ParseUInt32(std::string_view str, uint32_t* out)
{
    return ParseIntegral<uint32_t>(str, out);
}